

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_PatchVerticesIn::iterate
          (TessellationShaderTCTEgl_PatchVerticesIn *this)

{
  GLenum GVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  pointer p_Var8;
  TestError *pTVar9;
  TestLog *this_00;
  MessageBuilder *pMVar10;
  MessageBuilder local_1d8;
  uint local_58;
  uint local_54;
  uint te_PatchVerticesInSize;
  uint n_vertex;
  int *mapped_data_ptr;
  uint n_bytes_needed;
  uint local_34;
  iterator iStack_30;
  GLint n_patch_vertices;
  __normal_iterator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
  local_28;
  __normal_iterator<const_glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
  local_20;
  _tests_const_iterator test_iterator;
  Functions *gl;
  TessellationShaderTCTEgl_PatchVerticesIn *this_local;
  
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[3])();
  test_iterator._M_current = (_test_descriptor *)CONCAT44(extraout_var,iVar5);
  initTest(this);
  (**(code **)&test_iterator._M_current[0x35].vs_id)(0x8c89);
  dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
  glu::checkError(dVar6,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x1005);
  local_28._M_current =
       (_test_descriptor *)
       std::
       vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
       ::begin(&this->m_tests);
  __gnu_cxx::
  __normal_iterator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_const*,std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>>
  ::__normal_iterator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor*>
            ((__normal_iterator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_const*,std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>>
              *)&local_20,&local_28);
  do {
    iStack_30 = std::
                vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
                ::end(&this->m_tests);
    bVar4 = __gnu_cxx::operator!=(&local_20,&stack0xffffffffffffffd0);
    if (!bVar4) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    pcVar3 = *(code **)&test_iterator._M_current[0xcd].vs_id;
    p_Var8 = __gnu_cxx::
             __normal_iterator<const_glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
             ::operator->(&local_20);
    (*pcVar3)(p_Var8->po_id);
    dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
    glu::checkError(dVar6,"glUseProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x100c);
    local_34 = 0;
    p_Var8 = __gnu_cxx::
             __normal_iterator<const_glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
             ::operator->(&local_20);
    if (p_Var8->type == TESSELLATION_TEST_TYPE_FIRST) {
      (**(code **)&test_iterator._M_current[0x90].input_patch_size)
                ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,4);
      dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
      glu::checkError(dVar6,"glPatchParameteriEXT() for GL_PATCH_VERTICES_EXT failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x101b);
      local_34 = 4;
    }
    else {
      if (p_Var8->type != TESSELLATION_TEST_TYPE_TES) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,"Unrecognized test type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0x102e);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pcVar3 = *(code **)&test_iterator._M_current[0x90].input_patch_size;
      GVar1 = (this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES;
      p_Var8 = __gnu_cxx::
               __normal_iterator<const_glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
               ::operator->(&local_20);
      (*pcVar3)(GVar1,p_Var8->input_patch_size);
      dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
      glu::checkError(dVar6,"glPatchParameteriEXT() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x1025);
      p_Var8 = __gnu_cxx::
               __normal_iterator<const_glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
               ::operator->(&local_20);
      local_34 = p_Var8->input_patch_size;
    }
    mapped_data_ptr._0_4_ = 8;
    (**(code **)(test_iterator._M_current + 0xc))(0x8c8e,8,0,0x88e4);
    dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
    glu::checkError(dVar6,"glBufferData() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x1038);
    (**(code **)&test_iterator._M_current[1].vs_id)(0);
    dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
    glu::checkError(dVar6,"glBeginTransformFeedback() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x103c);
    (**(code **)&test_iterator._M_current[0x2f].vs_id)
              ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,local_34);
    dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
    glu::checkError(dVar6,"glDrawArrays() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x1041);
    (**(code **)&test_iterator._M_current[0x38].input_patch_size)();
    dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
    glu::checkError(dVar6,"glEndTransformFeedback() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x1044);
    _te_PatchVerticesInSize =
         (**(code **)&test_iterator._M_current[0x76].input_patch_size)(0x8c8e,0,8,1);
    dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
    glu::checkError(dVar6,"glMapBufferRange() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x104a);
    for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
      uVar2 = *(uint *)(_te_PatchVerticesInSize + (ulong)local_54 * 4);
      local_58 = uVar2;
      p_Var8 = __gnu_cxx::
               __normal_iterator<const_glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
               ::operator->(&local_20);
      if (uVar2 != p_Var8->input_patch_size) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_1d8,
                             (char (*) [49])"Invalid gl_PatchVerticesIn defined for TE stage ");
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(char (*) [26])" and result vertex index:");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_54);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [11])0x2ad26ab);
        p_Var8 = __gnu_cxx::
                 __normal_iterator<const_glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
                 ::operator->(&local_20);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&p_Var8->input_patch_size);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [11])0x2acb888);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_58);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d8);
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,"Invalid gl_PatchVerticesIn size used in TE stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0x105a);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    (**(code **)&test_iterator._M_current[0xcd].fs_id)(0x8c8e);
    dVar6 = (**(code **)&test_iterator._M_current[0x49].fs_id)();
    glu::checkError(dVar6,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x1060);
    __gnu_cxx::
    __normal_iterator<const_glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_PatchVerticesIn::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize ES test objects */
	initTest();

	/* Prepare for rendering */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");

	/* We will iterate through all added tests. */
	for (_tests_const_iterator test_iterator = m_tests.begin(); test_iterator != m_tests.end(); ++test_iterator)
	{
		/* Activate test-specific program object first. */
		gl.useProgram(test_iterator->po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

		/* Test type tells determines how the tessellation levels should be set.
		 * We don't need to do anything specific if TCS+TES are in, but if no
		 * TCS is present, we need to configure default amount of input patch-vertices
		 * to the test-specific value.
		 */
		glw::GLint n_patch_vertices = 0;

		switch (test_iterator->type)
		{
		case TESSELLATION_TEST_TYPE_TCS_TES:
		{
			/* We're using isolines mode which requires at least 4 input vertices per patch */
			gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() for GL_PATCH_VERTICES_EXT failed.");

			n_patch_vertices = 4;

			break;
		}

		case TESSELLATION_TEST_TYPE_TES:
		{
			gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, test_iterator->input_patch_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

			n_patch_vertices = test_iterator->input_patch_size;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized test type");
		}
		} /* switch (test_iterator->type) */

		/* Set up storage properties for the buffer object, to which XFBed data will be
		 * written.
		 **/
		const unsigned int n_bytes_needed = sizeof(int) * 2; /* the tessellator will output two vertices */

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, n_bytes_needed, NULL /* data */, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed");

		/* Render the test geometry */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");
		{
			/* Pass a single patch only */
			gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, n_patch_vertices);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

		/* Now that the BO is filled with data, map it so we can check the storage's contents */
		const int* mapped_data_ptr = (const int*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
																   n_bytes_needed, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

		/* Verify the contents. Make sure the value we retrieved is equal to the test-specific
		 * amount of vertices per patch.
		 */
		for (unsigned int n_vertex = 0; n_vertex < 2 /* output vertices */; ++n_vertex)
		{
			unsigned int te_PatchVerticesInSize = mapped_data_ptr[n_vertex];

			if (te_PatchVerticesInSize != test_iterator->input_patch_size)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PatchVerticesIn defined for TE stage "
								   << " and result vertex index:" << n_vertex
								   << " expected:" << test_iterator->input_patch_size
								   << " rendered:" << te_PatchVerticesInSize << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PatchVerticesIn size used in TE stage");
			} /* if (comparison failed)  */
		}

		/* All done - unmap the storage */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
	} /* for (all tests) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}